

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_rightShift_uvec4(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar16;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint uVar17;
  uint uVar18;
  
  fVar1 = c->in[0].m_data[0];
  fVar2 = c->in[0].m_data[1];
  fVar3 = c->in[0].m_data[2];
  fVar4 = c->in[0].m_data[3];
  iVar10 = (int)fVar1;
  iVar11 = (int)fVar2;
  iVar12 = (int)fVar3;
  iVar13 = (int)fVar4;
  auVar14._0_4_ = iVar10 >> 0x1f;
  auVar14._4_4_ = iVar11 >> 0x1f;
  auVar14._8_4_ = iVar12 >> 0x1f;
  auVar14._12_4_ = iVar13 >> 0x1f;
  auVar6._0_4_ = (int)(fVar1 - 2.1474836e+09);
  auVar6._4_4_ = (int)(fVar2 - 2.1474836e+09);
  auVar6._8_4_ = (int)(fVar3 - 2.1474836e+09);
  auVar6._12_4_ = (int)(fVar4 - 2.1474836e+09);
  auVar7._4_4_ = iVar11;
  auVar7._0_4_ = iVar10;
  auVar7._8_4_ = iVar12;
  auVar7._12_4_ = iVar13;
  auVar7 = auVar6 & auVar14 | auVar7;
  auVar8._0_4_ = (int)c->in[1].m_data[0];
  auVar8._4_4_ = (int)c->in[1].m_data[1];
  auVar8._8_4_ = (int)c->in[1].m_data[2];
  auVar8._12_4_ = (int)c->in[1].m_data[3];
  auVar15 = pshuflw(auVar14,auVar8,0x54);
  uVar18 = auVar7._0_4_ >> auVar15._0_8_;
  auVar9 = pshuflw(auVar8,auVar8,0xfe);
  uVar16 = auVar7._12_4_ >> auVar9._0_8_;
  auVar15._4_4_ = auVar8._8_4_;
  auVar15._0_4_ = auVar8._12_4_;
  auVar15._8_4_ = auVar8._4_4_;
  auVar15._12_4_ = auVar8._0_4_;
  auVar15 = pshuflw(auVar9,auVar15,0xfe);
  uVar17 = auVar7._8_4_ >> auVar15._0_8_;
  auVar9._4_4_ = auVar8._8_4_;
  auVar9._0_4_ = auVar8._12_4_;
  auVar9._8_4_ = auVar8._4_4_;
  auVar9._12_4_ = auVar8._0_4_;
  auVar15 = pshuflw(auVar15,auVar9,0x54);
  uVar5 = auVar7._4_4_ >> auVar15._0_8_;
  (c->color).m_data[0] =
       ((float)(uVar5 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(uVar5 & 0xffff | 0x4b000000);
  (c->color).m_data[1] =
       ((float)(uVar17 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(uVar17 & 0xffff | 0x4b000000)
  ;
  (c->color).m_data[2] =
       ((float)(uVar16 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(uVar16 & 0xffff | 0x4b000000)
  ;
  (c->color).m_data[3] =
       ((float)(uVar18 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(uVar18 & 0xffff | 0x4b000000)
  ;
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }